

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestWriter.cpp
# Opt level: O3

void __thiscall
OpenMD::RestWriter::writeRest
          (RestWriter *this,
          vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
          *restInfo)

{
  char cVar1;
  byte bVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  pointer pmVar5;
  RealType RVar6;
  
  bVar2 = this->createRestFile_;
  if ((bool)bVar2 == true) {
    RVar6 = Snapshot::getTime(this->info_->sman_->currentSnapshot_);
    std::ostream::_M_insert<double>(RVar6);
    bVar2 = this->createRestFile_;
  }
  if ((bVar2 & 1) != 0) {
    pmVar5 = (restInfo->
             super__Vector_base<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pmVar5 != (restInfo->
                  super__Vector_base<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        for (p_Var4 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var4 != &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          std::__ostream_insert<char,std::char_traits<char>>(this->output_,"\t",1);
          poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
          std::ostream::_M_insert<double>((double)p_Var4[1]._M_left);
        }
        cVar1 = (char)this->output_;
        std::ios::widen((char)*(undefined8 *)(*(long *)this->output_ + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        pmVar5 = pmVar5 + 1;
      } while (pmVar5 != (restInfo->
                         super__Vector_base<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    }
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void RestWriter::writeRest(
      std::vector<std::map<int, Restraint::RealPair>> restInfo) {
#ifdef IS_MPI
    MPI_Status istatus;
#endif

#ifndef IS_MPI
    if (createRestFile_)
      (*output_)
          << info_->getSnapshotManager()->getCurrentSnapshot()->getTime();

    // output some information about the molecules
    std::vector<std::map<int, Restraint::RealPair>>::const_iterator i;
    std::map<int, Restraint::RealPair>::const_iterator j;

    if (createRestFile_) {
      for (i = restInfo.begin(); i != restInfo.end(); ++i) {
        for (j = (*i).begin(); j != (*i).end(); ++j) {
          (*output_) << "\t" << (j->second).first << "\t" << (j->second).second;
        }
        (*output_) << std::endl;
      }
      (*output_).flush();
    }
#else
    std::string buffer, first, second;
    std::stringstream ss;

    std::vector<std::map<int, Restraint::RealPair>>::const_iterator i;
    std::map<int, Restraint::RealPair>::const_iterator j;

    if (createRestFile_) {
      for (i = restInfo.begin(); i != restInfo.end(); ++i) {
        for (j = (*i).begin(); j != (*i).end(); ++j) {
          ss.clear();
          ss << (j->second).first;
          ss >> first;
          ss.clear();
          ss << (j->second).second;
          ss >> second;
          buffer += ("\t" + first + "\t" + second);
        }
        buffer += "\n";
      }
    }

    const int primaryNode = 0;

    if (createRestFile_) {
      if (worldRank == primaryNode) {
        (*output_)
            << info_->getSnapshotManager()->getCurrentSnapshot()->getTime();
        (*output_) << buffer;

        int nProc;
        MPI_Comm_size(MPI_COMM_WORLD, &nProc);
        for (int i = 1; i < nProc; ++i) {
          // receive the length of the string buffer that was
          // prepared by processor i

          int recvLength;
          MPI_Recv(&recvLength, 1, MPI_INT, i, 0, MPI_COMM_WORLD, &istatus);
          char* recvBuffer = new char[recvLength];
          if (recvBuffer == NULL) {
          } else {
            MPI_Recv(recvBuffer, recvLength, MPI_CHAR, i, 0, MPI_COMM_WORLD,
                     &istatus);
            if (createRestFile_) (*output_) << recvBuffer;

            delete[] recvBuffer;
          }
        }
        (*output_).flush();
      } else {
        int sendBufferLength = buffer.size() + 1;
        MPI_Send(&sendBufferLength, 1, MPI_INT, primaryNode, 0, MPI_COMM_WORLD);
        MPI_Send((void*)buffer.c_str(), sendBufferLength, MPI_CHAR, primaryNode,
                 0, MPI_COMM_WORLD);
      }
    }
#endif  // is_mpi
  }